

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglvertexarrayobject.cpp
# Opt level: O1

int __thiscall
QOpenGLVertexArrayObjectPrivate::bind
          (QOpenGLVertexArrayObjectPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_enum_32 aVar1;
  int iVar2;
  qt_BindVertexArray_t *pp_Var3;
  
  aVar1 = this->vaoFuncsType;
  if (aVar1 - ARB < 3) {
    pp_Var3 = &((this->vaoFuncs).helper)->BindVertexArray;
  }
  else {
    if ((aVar1 != Core_3_0) && (aVar1 != Core_3_2)) {
      return aVar1;
    }
    pp_Var3 = (qt_BindVertexArray_t *)
              ((((this->vaoFuncs).core_3_0)->d_3_0_Core->field_0).functions + 3);
  }
  iVar2 = (**pp_Var3)(this->vao);
  return iVar2;
}

Assistant:

void QOpenGLVertexArrayObjectPrivate::bind()
{
    switch (vaoFuncsType) {
#if !QT_CONFIG(opengles2)
    case Core_3_2:
        vaoFuncs.core_3_2->glBindVertexArray(vao);
        break;
    case Core_3_0:
        vaoFuncs.core_3_0->glBindVertexArray(vao);
        break;
#endif
    case ARB:
    case APPLE:
    case OES:
        vaoFuncs.helper->glBindVertexArray(vao);
        break;
    default:
        break;
    }
}